

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qcontainertools_impl.h
# Opt level: O2

bool QtPrivate::sequential_erase_one<QList<QDockWidget*>,QDockWidget_const*>
               (QList<QDockWidget_*> *c,QDockWidget **t)

{
  QDockWidget **ppQVar1;
  QDockWidget **ppQVar2;
  const_iterator pos;
  
  ppQVar2 = (c->d).ptr;
  ppQVar1 = ppQVar2 + (c->d).size;
  pos = std::
        __find_if<QList<QDockWidget*>::const_iterator,__gnu_cxx::__ops::_Iter_equals_val<QDockWidget_const*const>>
                  (ppQVar2,ppQVar1,t);
  if (pos.i != ppQVar1) {
    QList<QDockWidget_*>::erase(c,pos);
  }
  return pos.i != ppQVar1;
}

Assistant:

auto sequential_erase_one(Container &c, const T &t)
{
    const auto cend = c.cend();
    const auto it = std::find(c.cbegin(), cend, t);
    if (it == cend)
        return false;
    c.erase(it);
    return true;
}